

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::setQueryCallback
          (CommonCore *this,LocalFederateId federateID,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
          *queryFunction,int order)

{
  string_view message;
  FederateState *this_00;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_RDX;
  FederateState *fed;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  int order_00;
  FederateState *in_stack_ffffffffffffff90;
  CommonCore *in_stack_ffffffffffffffa8;
  LocalFederateId in_stack_ffffffffffffffb4;
  
  order_00 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  this_00 = getFederateAt(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb4);
  if (this_00 == (FederateState *)0x0) {
    this_01 = (basic_string_view<char,_std::char_traits<char>_> *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_01,in_stack_ffffffffffffff78);
    message._M_str = (char *)in_stack_ffffffffffffff90;
    message._M_len = (size_t)in_RDX;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_01,message);
    __cxa_throw(this_01,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
              *)this_00,in_stack_ffffffffffffff68);
  FederateState::setQueryCallback(in_stack_ffffffffffffff90,in_RDX,order_00);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x540e39);
  return;
}

Assistant:

void CommonCore::setQueryCallback(LocalFederateId federateID,
                                  std::function<std::string(std::string_view)> queryFunction,
                                  int order)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("FederateID is invalid (setQueryCallback)"));
    }
    fed->setQueryCallback(std::move(queryFunction), order);
}